

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void mocker::ir::printFunc(FunctionModule *func,ostream *out)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  BasicBlockList *this;
  reference this_00;
  size_t sVar8;
  InstList *this_01;
  ir *this_02;
  element_type *this_03;
  ulong uVar9;
  char *pcVar10;
  shared_ptr<mocker::ir::IRInst> *inst_00;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  shared_ptr<mocker::ir::AttachedComment> p;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end3;
  const_iterator __begin3;
  InstList *__range3;
  BasicBlock *bb;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockList *__range2;
  ulong local_50;
  size_t i;
  undefined1 local_38 [8];
  string attachedComment;
  ostream *out_local;
  FunctionModule *func_local;
  
  attachedComment.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_38);
  poVar3 = std::operator<<((ostream *)attachedComment.field_2._8_8_,"define ");
  psVar4 = FunctionModule::getIdentifier_abi_cxx11_(func);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::operator<<(poVar3," ( ");
  local_50 = 0;
  while( true ) {
    pvVar5 = FunctionModule::getArgs_abi_cxx11_(func);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar5);
    if (sVar6 <= local_50) break;
    if (local_50 != 0) {
      std::operator<<((ostream *)attachedComment.field_2._8_8_," ");
    }
    uVar1 = attachedComment.field_2._8_8_;
    pvVar5 = FunctionModule::getArgs_abi_cxx11_(func);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar5,local_50);
    std::operator<<((ostream *)uVar1,(string *)pvVar7);
    local_50 = local_50 + 1;
  }
  std::operator<<((ostream *)attachedComment.field_2._8_8_," )");
  bVar2 = FunctionModule::isExternalFunc(func);
  if (bVar2) {
    std::operator<<((ostream *)attachedComment.field_2._8_8_," external\n");
  }
  else {
    std::operator<<((ostream *)attachedComment.field_2._8_8_," {\n");
    this = FunctionModule::getBBs_abi_cxx11_(func);
    __end2 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(this);
    bb = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (this);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&bb), bVar2) {
      this_00 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2);
      poVar3 = std::operator<<((ostream *)attachedComment.field_2._8_8_,"<");
      sVar8 = BasicBlock::getLabelID(this_00);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar8);
      std::operator<<(poVar3,">:\n");
      this_01 = BasicBlock::getInsts_abi_cxx11_(this_00);
      __end3 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::begin(this_01);
      inst = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(this_01);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&inst), bVar2) {
        this_02 = (ir *)std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                                  (&__end3);
        dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)(str.field_2._M_local_buf + 8),(shared_ptr<mocker::ir::IRInst> *)this_02);
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)(str.field_2._M_local_buf + 8));
        if (bVar2) {
          this_03 = std::
                    __shared_ptr_access<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(str.field_2._M_local_buf + 8));
          psVar4 = AttachedComment::getContent_abi_cxx11_(this_03);
          std::__cxx11::string::operator=((string *)local_38,(string *)psVar4);
        }
        std::shared_ptr<mocker::ir::AttachedComment>::~shared_ptr
                  ((shared_ptr<mocker::ir::AttachedComment> *)((long)&str.field_2 + 8));
        if (!bVar2) {
          fmtInst_abi_cxx11_(&local_e8,this_02,inst_00);
          uVar9 = std::__cxx11::string::empty();
          bVar2 = (uVar9 & 1) != 0;
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
          }
          else {
            std::operator+(&local_108,"  ; ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,&local_e8,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          if (bVar2) {
            std::allocator<char>::~allocator(&local_109);
          }
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::clear();
          pcVar10 = (char *)std::__cxx11::string::at((ulong)local_c8);
          if (*pcVar10 != ';') {
            std::operator<<((ostream *)attachedComment.field_2._8_8_,"  ");
          }
          poVar3 = std::operator<<((ostream *)attachedComment.field_2._8_8_,(string *)local_c8);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string((string *)local_c8);
        }
        std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end3);
      }
      std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2);
    }
    poVar3 = std::operator<<((ostream *)attachedComment.field_2._8_8_,"}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void printFunc(const FunctionModule &func, std::ostream &out) {
  std::string attachedComment;

  out << "define " << func.getIdentifier() << " ( ";
  for (std::size_t i = 0; i < func.getArgs().size(); ++i) {
    if (i != 0)
      out << " ";
    out << func.getArgs()[i];
  }
  out << " )";
  if (func.isExternalFunc()) {
    out << " external\n";
    return;
  }
  out << " {\n";
  for (const auto &bb : func.getBBs()) {
    out << "<" << bb.getLabelID() << ">:\n";
    for (const auto &inst : bb.getInsts()) {
      if (auto p = dyc<AttachedComment>(inst)) {
        attachedComment = p->getContent();
        continue;
      }

      auto str = fmtInst(inst) +
                 (attachedComment.empty() ? "" : "  ; " + attachedComment);
      attachedComment.clear();
      if (str.at(0) != ';')
        out << "  ";
      out << str << "\n";
    }
  }
  out << "}" << std::endl;
}